

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

long true_moves(void)

{
  int iVar1;
  int32_t iVar2;
  flag sg_flags;
  you sg_you;
  flag local_6f0;
  you local_640;
  
  iVar1 = diff_base.pos;
  if (loginfo.out_of_sync != '\0') {
    diff_base.pos = 0;
    uptodate(&diff_base,(char *)0x0);
    restore_flags(&diff_base,&local_6f0);
    restore_you(&diff_base,&local_640);
    iVar2 = mread32(&diff_base);
    diff_base.pos = iVar1;
    return (long)iVar2;
  }
  return (ulong)moves;
}

Assistant:

static long true_moves(void)
{
    struct you sg_you;
    struct flag sg_flags;
    long rv, pos;

    if (!loginfo.out_of_sync)
	return moves;

    pos = diff_base.pos;
    diff_base.pos = 0;

    /* Mimic memfile reading in dorecover() to reach where moves is stored.
     * Update this if the initial part of the save format ever changes. */
    uptodate(&diff_base, NULL);
    restore_flags(&diff_base, &sg_flags);
    restore_you(&diff_base, &sg_you);
    rv = mread32(&diff_base);	/* read out moves here */

    diff_base.pos = pos;

    return rv;
}